

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<char_const(&)[6]>::operator<=
          (result *__return_storage_ptr__,expression_lhs<char_const(&)[6]> *this,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  lest *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  allocator<char> local_89;
  string local_88 [32];
  string local_68;
  undefined8 local_48;
  char *pcStack_40;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_38;
  bool local_21;
  string *local_20;
  basic_string_view<char,_std::char_traits<char>_> *rhs_local;
  expression_lhs<const_char_(&)[6]> *this_local;
  
  local_20 = (string *)rhs;
  rhs_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  this_local = (expression_lhs<const_char_(&)[6]> *)__return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,*(char **)this)
  ;
  local_48 = *(undefined8 *)local_20;
  pcStack_40 = (char *)local_20->_M_string_length;
  local_21 = std::operator<=(local_38,*(basic_string_view<char,_std::char_traits<char>_> *)local_20)
  ;
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"<=",&local_89);
  to_string<char[6],std::basic_string_view<char,std::char_traits<char>>>
            (&local_68,this_00,(char (*) [6])local_88,local_20,in_R8);
  result::result<bool>(__return_storage_ptr__,&local_21,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }